

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void sai_terminate_sparse_arrays(void)

{
  Integer IVar1;
  void *pvVar2;
  _sparse_array *__ptr;
  long lVar3;
  
  lVar3 = 0;
  __ptr = SPA;
  do {
    IVar1 = *(Integer *)((long)&__ptr->g_data + lVar3);
    if (GA[IVar1 + 1000].actv == 1) {
      pnga_destroy(IVar1);
      __ptr = SPA;
    }
    IVar1 = *(Integer *)((long)&__ptr->g_i + lVar3);
    if (GA[IVar1 + 1000].actv == 1) {
      pnga_destroy(IVar1);
      __ptr = SPA;
    }
    IVar1 = *(Integer *)((long)&__ptr->g_j + lVar3);
    if (GA[IVar1 + 1000].actv == 1) {
      pnga_destroy(IVar1);
      __ptr = SPA;
    }
    pvVar2 = *(void **)((long)&__ptr->blkidx + lVar3);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      __ptr = SPA;
    }
    pvVar2 = *(void **)((long)&__ptr->blksize + lVar3);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      __ptr = SPA;
    }
    pvVar2 = *(void **)((long)&__ptr->offset + lVar3);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      __ptr = SPA;
    }
    pvVar2 = *(void **)((long)&__ptr->idx + lVar3);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      __ptr = SPA;
    }
    pvVar2 = *(void **)((long)&__ptr->jdx + lVar3);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      __ptr = SPA;
    }
    pvVar2 = *(void **)((long)&__ptr->val + lVar3);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      __ptr = SPA;
    }
    lVar3 = lVar3 + 200;
  } while (lVar3 != 0x640000);
  free(__ptr);
  return;
}

Assistant:

void sai_terminate_sparse_arrays()
{
  Integer i;
  for (i=0; i<MAX_ARRAYS; i++) {
    Integer ga = SPA[i].g_data + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_data);
    ga = SPA[i].g_i + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_i);
    ga = SPA[i].g_j + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_j);
    if (SPA[i].blkidx) free(SPA[i].blkidx);
    if (SPA[i].blksize) free(SPA[i].blksize);
    if (SPA[i].offset) free(SPA[i].offset);
    if (SPA[i].idx) free(SPA[i].idx);
    if (SPA[i].jdx) free(SPA[i].jdx);
    if (SPA[i].val) free(SPA[i].val);
  }
  free(SPA);
}